

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_regressor.cc
# Opt level: O2

void initialize_regressor<sparse_parameters>(vw *all,sparse_parameters *weights)

{
  uint32_t stride_shift;
  uint32_t uVar1;
  code *pcVar2;
  ostream *poVar3;
  vw_exception *this;
  string asStack_1e8 [2];
  stringstream __msg;
  ostream local_198;
  
  if ((weights->_weight_mask == 0) || ((weights->_map)._M_h._M_element_count == 0)) {
    uVar1 = all->num_bits;
    stride_shift = weights->_stride_shift;
    sparse_parameters::~sparse_parameters(weights);
    sparse_parameters::sparse_parameters(weights,1L << ((byte)uVar1 & 0x3f),stride_shift);
    if (weights->_weight_mask == 0) {
      std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
      poVar3 = std::operator<<(&local_198," Failed to allocate weight array with ");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::operator<<(poVar3," bits: try decreasing -b <bits>");
      this = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (this,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/parse_regressor.cc"
                 ,0x74,asStack_1e8);
      __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    if ((all->initial_weight != 0.0) || (NAN(all->initial_weight))) {
      sparse_parameters::set_default<float,set_initial_wrapper<sparse_parameters>>
                (weights,&all->initial_weight);
      return;
    }
    if (all->random_positive_weights == true) {
      pcVar2 = random_positive_wrapper<sparse_parameters>::func;
    }
    else if (all->random_weights == true) {
      pcVar2 = random_weights_wrapper<sparse_parameters>::func;
    }
    else {
      if (all->normal_weights != true) {
        if (all->tnormal_weights != true) {
          return;
        }
        weights->fun = polar_normal_weights_wrapper<sparse_parameters>::func;
        truncate<sparse_parameters>(all,weights);
        return;
      }
      pcVar2 = polar_normal_weights_wrapper<sparse_parameters>::func;
    }
    weights->fun = pcVar2;
  }
  return;
}

Assistant:

void initialize_regressor(vw& all, T& weights)
{
  // Regressor is already initialized.

  if (weights.not_null())
    return;
  size_t length = ((size_t)1) << all.num_bits;
  try
  {
    uint32_t ss = weights.stride_shift();
    weights.~T();  // dealloc so that we can realloc, now with a known size
    new (&weights) T(length, ss);
  }
  catch (const VW::vw_exception&)
  {
    THROW(" Failed to allocate weight array with " << all.num_bits << " bits: try decreasing -b <bits>");
  }
  if (weights.mask() == 0)
  {
    THROW(" Failed to allocate weight array with " << all.num_bits << " bits: try decreasing -b <bits>");
  }
  else if (all.initial_weight != 0.)
    weights.template set_default<float, set_initial_wrapper<T> >(all.initial_weight);
  else if (all.random_positive_weights)
    weights.template set_default<random_positive_wrapper<T> >();
  else if (all.random_weights)
    weights.template set_default<random_weights_wrapper<T> >();
  else if (all.normal_weights)
  {
    weights.template set_default<polar_normal_weights_wrapper<T> >();
  }
  else if (all.tnormal_weights)
  {
    weights.template set_default<polar_normal_weights_wrapper<T> >();
    truncate(all, weights);
  }
}